

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ReporterBase::listTests
          (ReporterBase *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  ostream *out;
  ColourImpl *streamColour;
  int iVar1;
  Verbosity verbosity;
  
  out = this->m_stream;
  streamColour = (this->m_colour).m_ptr;
  iVar1 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[0xe])();
  verbosity = (*((this->super_IEventListener).m_config)->_vptr_IConfig[0x16])();
  defaultListTests(out,streamColour,tests,SUB41(iVar1,0),verbosity);
  return;
}

Assistant:

void ReporterBase::listTests(std::vector<TestCaseHandle> const& tests) {
        defaultListTests(m_stream,
                         m_colour.get(),
                         tests,
                         m_config->hasTestFilters(),
                         m_config->verbosity());
    }